

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O3

ostream * wasm::anon_unknown_12::operator<<(ostream *o,Mode *mode)

{
  long lVar1;
  char *pcVar2;
  
  switch((ulong)mode & 0xffffffff) {
  case 0:
    pcVar2 = "split";
    lVar1 = 5;
    break;
  case 1:
    pcVar2 = "instrument";
    lVar1 = 10;
    break;
  case 2:
    pcVar2 = "merge-profiles";
    lVar1 = 0xe;
    break;
  case 3:
    pcVar2 = "print-profile";
    lVar1 = 0xd;
    break;
  default:
    goto switchD_00116cb3_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
switchD_00116cb3_default:
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, WasmSplitOptions::Mode& mode) {
  switch (mode) {
    case WasmSplitOptions::Mode::Split:
      o << "split";
      break;
    case WasmSplitOptions::Mode::Instrument:
      o << "instrument";
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      o << "merge-profiles";
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      o << "print-profile";
      break;
  }
  return o;
}